

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O1

Lazy<cinatra::chunked_result> __thiscall
cinatra::coro_http_connection::read_chunked(coro_http_connection *this)

{
  implementation_type *piVar1;
  element_type *peVar2;
  undefined8 in_RSI;
  
  peVar2 = (element_type *)operator_new(0xc0,(nothrow_t *)&std::nothrow);
  if (peVar2 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar2->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2> =
         read_chunked;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar2->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)read_chunked;
    *(undefined8 *)&(peVar2->head_buf_).field_0x28 = in_RSI;
    peVar2->executor_ =
         (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)0x0;
    (peVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.service_ =
         (service_type *)0x0;
    piVar1 = (implementation_type *)
             ((long)&(peVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.
                     impl_ + 8);
    (piVar1->super_base_implementation_type).socket_ = 0;
    (piVar1->super_base_implementation_type).state_ = '\0';
    *(undefined3 *)&(piVar1->super_base_implementation_type).field_0x5 = 0;
    *(undefined1 *)
     ((long)&(peVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_ + 0x38
     ) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    *(undefined1 *)&(peVar2->head_buf_).max_size_ = 0;
  }
  return (LazyBase<cinatra::chunked_result,_false>)(LazyBase<cinatra::chunked_result,_false>)this;
}

Assistant:

async_simple::coro::Lazy<chunked_result> read_chunked() {
    if (head_buf_.size() > 0) {
      const char *data_ptr = asio::buffer_cast<const char *>(head_buf_.data());
      chunked_buf_.sputn(data_ptr, head_buf_.size());
      head_buf_.consume(head_buf_.size());
    }

    chunked_result result{};
    std::error_code ec{};
    size_t size = 0;

    if (std::tie(ec, size) = co_await async_read_until(chunked_buf_, CRCF);
        ec) {
      result.ec = ec;
      close();
      co_return result;
    }

    size_t buf_size = chunked_buf_.size();
    size_t additional_size = buf_size - size;
    const char *data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    std::string_view size_str(data_ptr, size - CRCF.size());
    size_t chunk_size;
    auto [ptr, err] = std::from_chars(
        size_str.data(), size_str.data() + size_str.size(), chunk_size, 16);
    if (err != std::errc{}) {
      CINATRA_LOG_ERROR << "bad chunked size";
      result.ec = std::make_error_code(std::errc::invalid_argument);
      co_return result;
    }

    chunked_buf_.consume(size);

    if (additional_size < size_t(chunk_size + 2)) {
      // not a complete chunk, read left chunk data.
      size_t size_to_read = chunk_size + 2 - additional_size;
      if (std::tie(ec, size) = co_await async_read(chunked_buf_, size_to_read);
          ec) {
        result.ec = ec;
        close();
        co_return result;
      }
    }

    if (chunk_size == 0) {
      // all finished, no more data
      chunked_buf_.consume(chunked_buf_.size());
      result.eof = true;
      co_return result;
    }

    data_ptr = asio::buffer_cast<const char *>(chunked_buf_.data());
    result.data = std::string_view{data_ptr, (size_t)chunk_size};
    chunked_buf_.consume(chunk_size + CRCF.size());

    co_return result;
  }